

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O3

void __thiscall SubprocessTestConsole::Run(SubprocessTestConsole *this)

{
  Test *this_00;
  bool bVar1;
  int iVar2;
  ExitStatus EVar3;
  Subprocess *this_01;
  SubprocessSet *this_02;
  string local_38;
  
  iVar2 = isatty(0);
  if (iVar2 != 0) {
    iVar2 = isatty(1);
    if (iVar2 != 0) {
      iVar2 = isatty(2);
      if (iVar2 != 0) {
        this_02 = &(this->super_SubprocessTest).subprocs_;
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,"test -t 0 -a -t 1 -a -t 2","");
        this_01 = SubprocessSet::Add(this_02,&local_38,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        bVar1 = testing::Test::Check
                          (g_current_test,this_01 != (Subprocess *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                           ,0x9a,"(Subprocess*)0 != subproc");
        if (bVar1) {
          while( true ) {
            bVar1 = Subprocess::Done(this_01);
            this_00 = g_current_test;
            if (bVar1) break;
            SubprocessSet::DoWork(this_02);
          }
          EVar3 = Subprocess::Finish(this_01);
          testing::Test::Check
                    (this_00,EVar3 == ExitSuccess,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                     ,0xa0,"ExitSuccess == subproc->Finish()");
        }
        else {
          g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(SubprocessTest, Console) {
  // Skip test if we don't have the console ourselves.
  if (isatty(0) && isatty(1) && isatty(2)) {
    Subprocess* subproc =
        subprocs_.Add("test -t 0 -a -t 1 -a -t 2", /*use_console=*/true);
    ASSERT_NE((Subprocess*)0, subproc);

    while (!subproc->Done()) {
      subprocs_.DoWork();
    }

    EXPECT_EQ(ExitSuccess, subproc->Finish());
  }
}